

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

FILE * print_prep(int table,int update)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *pFVar5;
  char *__format;
  ulong uVar6;
  char upath [128];
  
  if (updates == 0) {
    pFVar5 = (FILE *)tbl_open(table,"w");
    if (pFVar5 == (FILE *)0x0) {
      fprintf(_stderr,"Open failed for %s at %s:%d\n",tdefs[table].name,
              "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/print.c",
              0x3c);
      exit(1);
    }
  }
  else {
    uVar6 = (ulong)(uint)update;
    if (update < 1) {
      if (delete_segments == 0) {
        pcVar3 = env_config("DSS_PATH",".");
        sprintf(upath,"%s%cdelete.%d",pcVar3,0x2f,(ulong)(uint)-update);
      }
      else {
        delete_segment = delete_segment + 1;
        pcVar3 = env_config("DSS_PATH",".");
        sprintf(upath,"%s%cdelete.u%d.%d",pcVar3,0x2f,(ulong)(uint)-update % 10000,
                (ulong)(uint)delete_segment);
      }
    }
    else {
      if (insert_segments == 0) {
        pcVar4 = env_config("DSS_PATH",".");
        pcVar3 = tdefs[table].name;
        __format = "%s%c%s.u%d";
      }
      else {
        iVar1 = strcmp(tdefs[table].name,"orders.tbl");
        if (iVar1 == 0) {
          piVar2 = &insert_lineitem_segment;
        }
        else {
          piVar2 = &insert_orders_segment;
        }
        *piVar2 = *piVar2 + 1;
        pcVar4 = env_config("DSS_PATH",".");
        pcVar3 = tdefs[table].name;
        uVar6 = uVar6 % 10000;
        __format = "%s%c%s.u%d.%d";
      }
      sprintf(upath,__format,pcVar4,0x2f,pcVar3,uVar6);
    }
    pFVar5 = fopen64(upath,"w");
  }
  return (FILE *)pFVar5;
}

Assistant:

FILE *
print_prep(int table, int update)
{
	char upath[128];
	FILE *res;

	if (updates)
		{
		if (update > 0) /* updates */
			if ( insert_segments )
				{
				int this_segment;
				if(strcmp(tdefs[table].name,"orders.tbl"))
					this_segment=++insert_orders_segment;
				else 
					this_segment=++insert_lineitem_segment;
				sprintf(upath, "%s%c%s.u%d.%d", 
					env_config(PATH_TAG, PATH_DFLT),
					PATH_SEP, tdefs[table].name, update%10000,this_segment);
				}
			else
				{
				sprintf(upath, "%s%c%s.u%d",
				env_config(PATH_TAG, PATH_DFLT),
				PATH_SEP, tdefs[table].name, update);
				}
		else /* deletes */
			if ( delete_segments )
				{
				++delete_segment;
				sprintf(upath, "%s%cdelete.u%d.%d",
					env_config(PATH_TAG, PATH_DFLT), PATH_SEP, -update%10000,
					delete_segment);
				}
			else
				{
				sprintf(upath, "%s%cdelete.%d",
				env_config(PATH_TAG, PATH_DFLT), PATH_SEP, -update);
				}
		return(fopen(upath, "w"));
        }
    res = tbl_open(table, "w");
    OPEN_CHECK(res, tdefs[table].name);
    return(res);
}